

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O2

bool __thiscall xray_re::xr_ogf_v3::hierarchical(xr_ogf_v3 *this)

{
  ogf_model_type oVar1;
  
  oVar1 = (this->super_xr_ogf).m_model_type;
  return (bool)((byte)(0x8812 >> ((byte)oVar1 & 0x1f)) & oVar1 < 0x10);
}

Assistant:

bool xr_ogf_v3::hierarchical() const
{
	switch (m_model_type) {
	case MT3_HIERRARHY:
	case MT3_SKELETON_ANIM:
	case MT3_SKELETON_RIGID:
	case MT3_LOD:
		return true;
	default:
		return false;
	}
}